

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O3

void __thiscall OpenMD::TetrahedralityHBMatrix::initializeHistogram(TetrahedralityHBMatrix *this)

{
  pointer __s;
  uint uVar1;
  pointer *ppuVar2;
  ulong uVar3;
  
  uVar1 = (this->super_StaticAnalyser).nBins_;
  if (uVar1 != 0) {
    ppuVar2 = (pointer *)
              ((long)&(((this->Q_histogram_).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    uVar3 = 0;
    do {
      __s = ((_Vector_impl_data *)(ppuVar2 + -1))->_M_start;
      if (__s != *ppuVar2) {
        memset(__s,0,((long)*ppuVar2 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
        uVar1 = (this->super_StaticAnalyser).nBins_;
      }
      uVar3 = uVar3 + 1;
      ppuVar2 = ppuVar2 + 3;
    } while (uVar3 < uVar1);
  }
  return;
}

Assistant:

void TetrahedralityHBMatrix::initializeHistogram() {
    for (unsigned int i = 0; i < nBins_; i++) {
      std::fill(Q_histogram_[i].begin(), Q_histogram_[i].end(), 0);
    }
  }